

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O3

LPCUTF8 utf8::PrevCharFull(LPCUTF8 ptr,LPCUTF8 start)

{
  utf8char_t uVar1;
  
  if (start < ptr) {
    ptr = ptr + -1;
    if (start < ptr) {
      uVar1 = *ptr;
    }
    else {
      uVar1 = *ptr;
    }
    if ((char)uVar1 < '\0') {
      CodexAssert(true);
    }
  }
  return ptr;
}

Assistant:

LPCUTF8 PrevCharFull(LPCUTF8 ptr, LPCUTF8 start)
    {
        if (ptr > start)
        {
            LPCUTF8 current = ptr - 1;
            while (current > start && (*current & 0xC0) == 0x80)
                current--;
            if (NextChar(current) == ptr)
                return current;

            // It is not a valid encoding, just go back one character.
            return ptr - 1;
        }
        else
            return ptr;
    }